

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

void __thiscall
Gudhi::Simplex_tree<Stable_options>::root_members_recursive_deletion
          (Simplex_tree<Stable_options> *this)

{
  node_ptr pcVar1;
  node_ptr pcVar2;
  node_ptr pcVar3;
  node_ptr local_30;
  node_disposer<boost::container::dtl::allocator_destroyer<boost::container::new_allocator<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>_>_>,_boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5>
  local_28;
  
  pcVar1 = (node_ptr)
           ((long)&(this->root_).members_.
                   super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_int,_std::less<int>,_void,_void>
                   .
                   super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                   .m_icont.
                   super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           + 8);
  pcVar3 = *(node_ptr *)
            ((long)&(this->root_).members_.
                    super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_int,_std::less<int>,_void,_void>
                    .
                    super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                    .m_icont.
                    super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
            + 0x10);
  while( true ) {
    if (pcVar3 == pcVar1) {
      local_28.
      super_ebo_functor_holder<boost::container::dtl::allocator_destroyer<boost::container::new_allocator<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>_>_>,_void,_false>
      .
      super_allocator_destroyer<boost::container::new_allocator<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>_>_>
      .a_ = (allocator_destroyer<boost::container::new_allocator<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>_>_>
             )&(this->root_).members_;
      local_30 = pcVar1;
      local_28.traits_ =
           (bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>
            *)pcVar1;
      boost::intrusive::bstree_algorithms<boost::intrusive::rbtree_node_traits<void*,true>>::
      clear_and_dispose<boost::intrusive::detail::node_disposer<boost::container::dtl::allocator_destroyer<boost::container::new_allocator<boost::container::dtl::tree_node<std::pair<int_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>>>,void*,(boost::container::tree_type_enum)0,true>>>,boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<int_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>>>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,(boost::intrusive::algo_types)5>>
                (&local_30,&local_28);
      *(node_ptr *)
       ((long)&(this->root_).members_.
               super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_int,_std::less<int>,_void,_void>
               .
               super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
               .m_icont.
               super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
               .
               super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
       + 0x10) = pcVar1;
      *(node_ptr *)
       ((long)&(this->root_).members_.
               super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_int,_std::less<int>,_void,_void>
               .
               super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
               .m_icont.
               super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
               .
               super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
       + 0x18) = pcVar1;
      (this->root_).members_.
      super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_int,_std::less<int>,_void,_void>
      .
      super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
      .m_icont.
      super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
      .
      super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
      .
      super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
      .super_size_holder<true,_unsigned_long,_void> = 0;
      (((bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
         *)((long)&(this->root_).members_.
                   super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_int,_std::less<int>,_void,_void>
                   .
                   super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                   .m_icont.
                   super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           + 8))->
      super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
      ).holder.root.super_node.parent_ = (node_ptr)0x0;
      return;
    }
    if (pcVar3 == (node_ptr)0x0) break;
    if (*(int *)&(pcVar3[2].parent_)->left_ == *(int *)&pcVar3[1].parent_) {
      rec_delete(this,(Siblings *)pcVar3[2].parent_);
    }
    pcVar2 = pcVar3->right_;
    if (pcVar3->right_ == (node_ptr)0x0) {
      do {
        pcVar2 = pcVar3;
        pcVar3 = (node_ptr)((ulong)pcVar2->parent_ & 0xfffffffffffffffe);
      } while (pcVar2 == pcVar3->right_);
      if (pcVar2->right_ == pcVar3) {
        pcVar3 = pcVar2;
      }
    }
    else {
      do {
        pcVar3 = pcVar2;
        pcVar2 = pcVar3->left_;
      } while (pcVar3->left_ != (node_ptr)0x0);
    }
  }
  __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                "static pointer boost::intrusive::bhtraits_base<boost::container::dtl::tree_node<std::pair<const int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>>>, void *, boost::container::red_black_tree, true>, boost::intrusive::compact_rbtree_node<void *> *, boost::intrusive::dft_tag, 3>::to_value_ptr(const node_ptr &) [T = boost::container::dtl::tree_node<std::pair<const int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>>>, void *, boost::container::red_black_tree, true>, NodePtr = boost::intrusive::compact_rbtree_node<void *> *, Tag = boost::intrusive::dft_tag, Type = 3]"
               );
}

Assistant:

void root_members_recursive_deletion() {
    for (auto sh = root_.members().begin(); sh != root_.members().end(); ++sh) {
      if (has_children(sh)) {
        rec_delete(sh->second.children());
      }
    }
    root_.members().clear();
  }